

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O1

int Nwk_ObjFindFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  long lVar1;
  
  if (0 < (long)pObj->nFanins) {
    lVar1 = 0;
    do {
      if (pObj->pFanio[lVar1] == (Nwk_Obj_t *)0x0) {
        return -1;
      }
      if (pObj->pFanio[lVar1] == pFanin) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (pObj->nFanins != lVar1);
  }
  return -1;
}

Assistant:

int Nwk_ObjFindFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanin( pObj, pTemp, i )
        if ( pTemp == pFanin )
            return i;
    return -1;
}